

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void __thiscall
capnp::_::TestCapDestructor::TestCapDestructor
          (TestCapDestructor *this,Own<kj::PromiseFulfiller<void>_> *fulfiller)

{
  *(undefined8 *)&this->field_0x48 = 0;
  (this->super_Server)._vptr_Server = (_func_int **)0x62d5b8;
  *(undefined8 *)&this->field_0x40 = 0x62d5f0;
  *(Disposer **)&(this->super_Server).field_0x8 = fulfiller->disposer;
  *(PromiseFulfiller<void> **)&(this->super_Server).field_0x10 = fulfiller->ptr;
  fulfiller->ptr = (PromiseFulfiller<void> *)0x0;
  this->dummy = 0;
  TestInterfaceImpl::TestInterfaceImpl(&this->impl,&this->dummy);
  return;
}

Assistant:

TestCapDestructor(kj::Own<kj::PromiseFulfiller<void>>&& fulfiller)
      : fulfiller(kj::mv(fulfiller)), impl(dummy) {}